

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

AMQP_VALUE amqpvalue_create_end(END_HANDLE end)

{
  AMQP_VALUE pAVar1;
  
  if (end != (END_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(end->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_end(END_HANDLE end)
{
    AMQP_VALUE result;

    if (end == NULL)
    {
        result = NULL;
    }
    else
    {
        END_INSTANCE* end_instance = (END_INSTANCE*)end;
        result = amqpvalue_clone(end_instance->composite_value);
    }

    return result;
}